

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void av1_highbd_iwht4x4_16_add_c(tran_low_t *input,uint8_t *dest8,int stride,int bd)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint16_t *trans;
  undefined4 in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  uint16_t *dest;
  tran_low_t *op;
  tran_low_t *ip;
  tran_low_t e1;
  tran_low_t d1;
  tran_low_t c1;
  tran_low_t b1;
  tran_low_t a1;
  tran_low_t output [16];
  int i;
  int *piVar6;
  int *local_88;
  int local_68 [4];
  int local_58 [4];
  int local_48 [4];
  int local_38 [7];
  int local_1c;
  undefined4 local_18;
  int local_14;
  
  piVar6 = local_68;
  trans = (uint16_t *)(in_RSI << 1);
  local_88 = in_RDI;
  local_18 = in_ECX;
  local_14 = in_EDX;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    iVar2 = (local_88[4] >> 2) + (*local_88 >> 2);
    iVar3 = (local_88[8] >> 2) - (local_88[0xc] >> 2);
    iVar4 = iVar2 - iVar3 >> 1;
    iVar5 = iVar4 - (local_88[0xc] >> 2);
    iVar4 = iVar4 - (local_88[4] >> 2);
    *piVar6 = iVar2 - iVar5;
    piVar6[4] = iVar5;
    piVar6[8] = iVar4;
    piVar6[0xc] = iVar4 + iVar3;
    local_88 = local_88 + 1;
    piVar6 = piVar6 + 1;
  }
  local_88 = local_68;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    iVar2 = local_88[1] + *local_88;
    iVar3 = local_88[2] - local_88[3];
    iVar4 = iVar2 - iVar3 >> 1;
    iVar5 = iVar4 - local_88[3];
    iVar4 = iVar4 - local_88[1];
    range_check_value(iVar2 - iVar5,(char)local_18 + '\x01');
    range_check_value(iVar5,(char)local_18 + '\x01');
    range_check_value(iVar4,(char)local_18 + '\x01');
    range_check_value(iVar4 + iVar3,(char)local_18 + '\x01');
    uVar1 = highbd_clip_pixel_add((uint16_t)((ulong)piVar6 >> 0x30),(tran_high_t)trans,0);
    *trans = uVar1;
    uVar1 = highbd_clip_pixel_add((uint16_t)((ulong)piVar6 >> 0x30),(tran_high_t)trans,0);
    trans[local_14] = uVar1;
    uVar1 = highbd_clip_pixel_add((uint16_t)((ulong)piVar6 >> 0x30),(tran_high_t)trans,0);
    trans[local_14 << 1] = uVar1;
    uVar1 = highbd_clip_pixel_add((uint16_t)((ulong)piVar6 >> 0x30),(tran_high_t)trans,0);
    trans[local_14 * 3] = uVar1;
    local_88 = local_88 + 4;
    trans = trans + 1;
  }
  return;
}

Assistant:

void av1_highbd_iwht4x4_16_add_c(const tran_low_t *input, uint8_t *dest8,
                                 int stride, int bd) {
  /* 4-point reversible, orthonormal inverse Walsh-Hadamard in 3.5 adds,
     0.5 shifts per pixel. */
  int i;
  tran_low_t output[16];
  tran_low_t a1, b1, c1, d1, e1;
  const tran_low_t *ip = input;
  tran_low_t *op = output;
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);

  for (i = 0; i < 4; i++) {
    a1 = ip[4 * 0] >> UNIT_QUANT_SHIFT;
    c1 = ip[4 * 1] >> UNIT_QUANT_SHIFT;
    d1 = ip[4 * 2] >> UNIT_QUANT_SHIFT;
    b1 = ip[4 * 3] >> UNIT_QUANT_SHIFT;
    a1 += c1;
    d1 -= b1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= b1;
    d1 += c1;

    op[4 * 0] = a1;
    op[4 * 1] = b1;
    op[4 * 2] = c1;
    op[4 * 3] = d1;
    ip++;
    op++;
  }

  ip = output;
  for (i = 0; i < 4; i++) {
    a1 = ip[0];
    c1 = ip[1];
    d1 = ip[2];
    b1 = ip[3];
    a1 += c1;
    d1 -= b1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= b1;
    d1 += c1;

    range_check_value(a1, bd + 1);
    range_check_value(b1, bd + 1);
    range_check_value(c1, bd + 1);
    range_check_value(d1, bd + 1);

    dest[stride * 0] = highbd_clip_pixel_add(dest[stride * 0], a1, bd);
    dest[stride * 1] = highbd_clip_pixel_add(dest[stride * 1], b1, bd);
    dest[stride * 2] = highbd_clip_pixel_add(dest[stride * 2], c1, bd);
    dest[stride * 3] = highbd_clip_pixel_add(dest[stride * 3], d1, bd);

    ip += 4;
    dest++;
  }
}